

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmoid_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::Sigmoid_x86_fma::forward_inplace(Sigmoid_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 auVar4 [32];
  long lVar5;
  undefined1 (*pauVar6) [32];
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  
  iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar11 = 0;
  uVar10 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar10 = uVar11;
  }
  auVar47 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
  for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
    pvVar1 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->elemsize;
    sVar3 = bottom_top_blob->cstep;
    pauVar6 = (undefined1 (*) [32])(sVar3 * uVar11 * sVar2 + (long)pvVar1);
    lVar9 = 0;
    for (iVar8 = 0; auVar46 = auVar47._0_16_, iVar8 + 7 < iVar7; iVar8 = iVar8 + 8) {
      auVar17 = *pauVar6;
      auVar15._0_8_ = auVar17._0_8_ ^ 0x8000000080000000;
      auVar15._8_4_ = auVar17._8_4_ ^ 0x80000000;
      auVar15._12_4_ = auVar17._12_4_ ^ 0x80000000;
      auVar15._16_4_ = auVar17._16_4_ ^ 0x80000000;
      auVar15._20_4_ = auVar17._20_4_ ^ 0x80000000;
      auVar15._24_4_ = auVar17._24_4_ ^ 0x80000000;
      auVar15._28_4_ = auVar17._28_4_ ^ 0x80000000;
      auVar23._8_4_ = 0x42b0c0a5;
      auVar23._0_8_ = 0x42b0c0a542b0c0a5;
      auVar23._12_4_ = 0x42b0c0a5;
      auVar23._16_4_ = 0x42b0c0a5;
      auVar23._20_4_ = 0x42b0c0a5;
      auVar23._24_4_ = 0x42b0c0a5;
      auVar23._28_4_ = 0x42b0c0a5;
      auVar17 = vminps_avx(auVar15,auVar23);
      auVar24._8_4_ = 0xc2b0c0a5;
      auVar24._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar24._12_4_ = 0xc2b0c0a5;
      auVar24._16_4_ = 0xc2b0c0a5;
      auVar24._20_4_ = 0xc2b0c0a5;
      auVar24._24_4_ = 0xc2b0c0a5;
      auVar24._28_4_ = 0xc2b0c0a5;
      auVar4 = vmaxps_avx(auVar17,auVar24);
      auVar25._8_4_ = 0x3fb8aa3b;
      auVar25._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar25._12_4_ = 0x3fb8aa3b;
      auVar25._16_4_ = 0x3fb8aa3b;
      auVar25._20_4_ = 0x3fb8aa3b;
      auVar25._24_4_ = 0x3fb8aa3b;
      auVar25._28_4_ = 0x3fb8aa3b;
      auVar36._8_4_ = 0x3f000000;
      auVar36._0_8_ = 0x3f0000003f000000;
      auVar36._12_4_ = 0x3f000000;
      auVar36._16_4_ = 0x3f000000;
      auVar36._20_4_ = 0x3f000000;
      auVar36._24_4_ = 0x3f000000;
      auVar36._28_4_ = 0x3f000000;
      auVar13 = vfmadd213ps_fma(auVar25,auVar4,auVar36);
      auVar15 = vroundps_avx(ZEXT1632(auVar13),1);
      auVar17 = vcmpps_avx(ZEXT1632(auVar13),auVar15,1);
      auVar41._8_4_ = 0x3f800000;
      auVar41._0_8_ = 0x3f8000003f800000;
      auVar41._12_4_ = 0x3f800000;
      auVar41._16_4_ = 0x3f800000;
      auVar41._20_4_ = 0x3f800000;
      auVar41._24_4_ = 0x3f800000;
      auVar41._28_4_ = 0x3f800000;
      auVar17 = vandps_avx(auVar17,auVar41);
      auVar17 = vsubps_avx(auVar15,auVar17);
      auVar31._8_4_ = 0x3f318000;
      auVar31._0_8_ = 0x3f3180003f318000;
      auVar31._12_4_ = 0x3f318000;
      auVar31._16_4_ = 0x3f318000;
      auVar31._20_4_ = 0x3f318000;
      auVar31._24_4_ = 0x3f318000;
      auVar31._28_4_ = 0x3f318000;
      auVar13 = vfmsub231ps_fma(auVar4,auVar17,auVar31);
      auVar32._8_4_ = 0x395e8083;
      auVar32._0_8_ = 0x395e8083395e8083;
      auVar32._12_4_ = 0x395e8083;
      auVar32._16_4_ = 0x395e8083;
      auVar32._20_4_ = 0x395e8083;
      auVar32._24_4_ = 0x395e8083;
      auVar32._28_4_ = 0x395e8083;
      auVar14 = vfmsub231ps_fma(ZEXT1632(auVar13),auVar17,auVar32);
      auVar15 = ZEXT1632(auVar14);
      auVar4._28_4_ = 0x395e8083;
      auVar4._0_28_ =
           ZEXT1628(CONCAT412(auVar14._12_4_ * auVar14._12_4_,
                              CONCAT48(auVar14._8_4_ * auVar14._8_4_,
                                       CONCAT44(auVar14._4_4_ * auVar14._4_4_,
                                                auVar14._0_4_ * auVar14._0_4_))));
      auVar34._8_4_ = 0x39506967;
      auVar34._0_8_ = 0x3950696739506967;
      auVar34._12_4_ = 0x39506967;
      auVar34._16_4_ = 0x39506967;
      auVar34._20_4_ = 0x39506967;
      auVar34._24_4_ = 0x39506967;
      auVar34._28_4_ = 0x39506967;
      auVar42._8_4_ = 0x3ab743ce;
      auVar42._0_8_ = 0x3ab743ce3ab743ce;
      auVar42._12_4_ = 0x3ab743ce;
      auVar42._16_4_ = 0x3ab743ce;
      auVar42._20_4_ = 0x3ab743ce;
      auVar42._24_4_ = 0x3ab743ce;
      auVar42._28_4_ = 0x3ab743ce;
      auVar13 = vfmadd213ps_fma(auVar34,auVar15,auVar42);
      auVar43._8_4_ = 0x3c088908;
      auVar43._0_8_ = 0x3c0889083c088908;
      auVar43._12_4_ = 0x3c088908;
      auVar43._16_4_ = 0x3c088908;
      auVar43._20_4_ = 0x3c088908;
      auVar43._24_4_ = 0x3c088908;
      auVar43._28_4_ = 0x3c088908;
      auVar13 = vfmadd213ps_fma(ZEXT1632(auVar13),auVar15,auVar43);
      auVar44._8_4_ = 0x3d2aa9c1;
      auVar44._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar44._12_4_ = 0x3d2aa9c1;
      auVar44._16_4_ = 0x3d2aa9c1;
      auVar44._20_4_ = 0x3d2aa9c1;
      auVar44._24_4_ = 0x3d2aa9c1;
      auVar44._28_4_ = 0x3d2aa9c1;
      auVar13 = vfmadd213ps_fma(ZEXT1632(auVar13),auVar15,auVar44);
      auVar45._8_4_ = 0x3e2aaaaa;
      auVar45._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar45._12_4_ = 0x3e2aaaaa;
      auVar45._16_4_ = 0x3e2aaaaa;
      auVar45._20_4_ = 0x3e2aaaaa;
      auVar45._24_4_ = 0x3e2aaaaa;
      auVar45._28_4_ = 0x3e2aaaaa;
      auVar15 = ZEXT1632(auVar14);
      auVar13 = vfmadd213ps_fma(ZEXT1632(auVar13),auVar15,auVar45);
      auVar13 = vfmadd213ps_fma(ZEXT1632(auVar13),auVar15,auVar36);
      auVar14 = vfmadd213ps_fma(ZEXT1632(auVar13),auVar4,auVar15);
      auVar13._0_4_ = (int)auVar17._0_4_;
      auVar13._4_4_ = (int)auVar17._4_4_;
      auVar13._8_4_ = (int)auVar17._8_4_;
      auVar13._12_4_ = (int)auVar17._12_4_;
      auVar16._16_4_ = (int)auVar17._16_4_;
      auVar16._0_16_ = auVar13;
      auVar16._20_4_ = (int)auVar17._20_4_;
      auVar16._24_4_ = (int)auVar17._24_4_;
      auVar16._28_4_ = (int)auVar17._28_4_;
      auVar18 = vpslld_avx(auVar13,0x17);
      auVar13 = vpslld_avx(auVar16._16_16_,0x17);
      auVar13 = vpaddd_avx(auVar13,auVar46);
      auVar46 = vpaddd_avx(auVar18,auVar46);
      auVar17._16_16_ = auVar13;
      auVar17._0_16_ = auVar46;
      auVar26._0_4_ = auVar14._0_4_ + 1.0;
      auVar26._4_4_ = auVar14._4_4_ + 1.0;
      auVar26._8_4_ = auVar14._8_4_ + 1.0;
      auVar26._12_4_ = auVar14._12_4_ + 1.0;
      auVar26._16_4_ = 0x3f800000;
      auVar26._20_4_ = 0x3f800000;
      auVar26._24_4_ = 0x3f800000;
      auVar26._28_4_ = 0x3f800000;
      auVar46 = vfmadd213ps_fma(auVar17,auVar26,auVar41);
      auVar17 = vdivps_avx(auVar41,ZEXT1632(auVar46));
      *pauVar6 = auVar17;
      pauVar6 = pauVar6 + 1;
      lVar9 = lVar9 + 8;
    }
    for (; iVar8 + 3 < iVar7; iVar8 = iVar8 + 4) {
      auVar14._0_8_ = *(ulong *)*pauVar6 ^ 0x8000000080000000;
      auVar14._8_4_ = *(uint *)(*pauVar6 + 8) ^ 0x80000000;
      auVar14._12_4_ = *(uint *)(*pauVar6 + 0xc) ^ 0x80000000;
      auVar19._8_4_ = 0x42b0c0a5;
      auVar19._0_8_ = 0x42b0c0a542b0c0a5;
      auVar19._12_4_ = 0x42b0c0a5;
      auVar13 = vminps_avx(auVar14,auVar19);
      auVar20._8_4_ = 0xc2b0c0a5;
      auVar20._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar20._12_4_ = 0xc2b0c0a5;
      auVar18 = vmaxps_avx(auVar13,auVar20);
      auVar21._8_4_ = 0x3fb8aa3b;
      auVar21._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar21._12_4_ = 0x3fb8aa3b;
      auVar35._8_4_ = 0x3f000000;
      auVar35._0_8_ = 0x3f0000003f000000;
      auVar35._12_4_ = 0x3f000000;
      auVar13 = vfmadd213ps_fma(auVar21,auVar18,auVar35);
      auVar27._0_4_ = (int)auVar13._0_4_;
      auVar27._4_4_ = (int)auVar13._4_4_;
      auVar27._8_4_ = (int)auVar13._8_4_;
      auVar27._12_4_ = (int)auVar13._12_4_;
      auVar14 = vcvtdq2ps_avx(auVar27);
      auVar13 = vcmpps_avx(auVar13,auVar14,1);
      auVar13 = vandps_avx(auVar13,auVar46);
      auVar13 = vsubps_avx(auVar14,auVar13);
      auVar28._8_4_ = 0x3f318000;
      auVar28._0_8_ = 0x3f3180003f318000;
      auVar28._12_4_ = 0x3f318000;
      auVar14 = vfmsub231ps_fma(auVar18,auVar13,auVar28);
      auVar29._8_4_ = 0x395e8083;
      auVar29._0_8_ = 0x395e8083395e8083;
      auVar29._12_4_ = 0x395e8083;
      auVar18 = vfmsub231ps_fma(auVar14,auVar13,auVar29);
      auVar30._0_4_ = auVar18._0_4_ * auVar18._0_4_;
      auVar30._4_4_ = auVar18._4_4_ * auVar18._4_4_;
      auVar30._8_4_ = auVar18._8_4_ * auVar18._8_4_;
      auVar30._12_4_ = auVar18._12_4_ * auVar18._12_4_;
      auVar33._8_4_ = 0x39506967;
      auVar33._0_8_ = 0x3950696739506967;
      auVar33._12_4_ = 0x39506967;
      auVar37._8_4_ = 0x3ab743ce;
      auVar37._0_8_ = 0x3ab743ce3ab743ce;
      auVar37._12_4_ = 0x3ab743ce;
      auVar14 = vfmadd213ps_fma(auVar33,auVar18,auVar37);
      auVar38._8_4_ = 0x3c088908;
      auVar38._0_8_ = 0x3c0889083c088908;
      auVar38._12_4_ = 0x3c088908;
      auVar14 = vfmadd213ps_fma(auVar14,auVar18,auVar38);
      auVar39._8_4_ = 0x3d2aa9c1;
      auVar39._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar39._12_4_ = 0x3d2aa9c1;
      auVar14 = vfmadd213ps_fma(auVar14,auVar18,auVar39);
      auVar40._8_4_ = 0x3e2aaaaa;
      auVar40._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar40._12_4_ = 0x3e2aaaaa;
      auVar14 = vfmadd213ps_fma(auVar14,auVar18,auVar40);
      auVar14 = vfmadd213ps_fma(auVar14,auVar18,auVar35);
      auVar14 = vfmadd213ps_fma(auVar14,auVar30,auVar18);
      auVar18._0_4_ = auVar14._0_4_ + auVar47._0_4_;
      auVar18._4_4_ = auVar14._4_4_ + auVar47._4_4_;
      auVar18._8_4_ = auVar14._8_4_ + auVar47._8_4_;
      auVar18._12_4_ = auVar14._12_4_ + auVar47._12_4_;
      auVar22._0_4_ = (int)auVar13._0_4_;
      auVar22._4_4_ = (int)auVar13._4_4_;
      auVar22._8_4_ = (int)auVar13._8_4_;
      auVar22._12_4_ = (int)auVar13._12_4_;
      auVar13 = vpslld_avx(auVar22,0x17);
      auVar13 = vpaddd_avx(auVar13,auVar46);
      auVar13 = vfmadd213ps_fma(auVar13,auVar18,auVar46);
      auVar13 = vdivps_avx(auVar46,auVar13);
      *(undefined1 (*) [16])*pauVar6 = auVar13;
      pauVar6 = (undefined1 (*) [32])(*pauVar6 + 0x10);
      lVar9 = lVar9 + 4;
    }
    lVar5 = sVar3 * sVar2 * uVar11;
    for (; (int)lVar9 < iVar7; lVar9 = lVar9 + 1) {
      fVar12 = expf(-*(float *)((long)pvVar1 + lVar9 * 4 + lVar5));
      auVar47 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
      *(float *)((long)pvVar1 + lVar9 * 4 + lVar5) = 1.0 / (fVar12 + 1.0);
    }
  }
  return 0;
}

Assistant:

int Sigmoid_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_one_avx512, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_one_avx, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_one, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = 1.f / (1.f + expf(-*ptr));
            ptr++;
        }
    }

    return 0;
}